

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

void skipdata_opstr(char *opstr,uint8_t *buffer,size_t size)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  size_t size_00;
  char *buffer_00;
  
  if (size == 0) {
    *opstr = '\0';
  }
  else {
    iVar1 = cs_snprintf(opstr,0xa0,"0x%02x",(ulong)*buffer);
    if (size != 1) {
      size_00 = 0xa0 - (long)iVar1;
      buffer_00 = opstr + iVar1;
      sVar4 = 1;
      do {
        uVar2 = cs_snprintf(buffer_00,size_00,", 0x%02x",(ulong)buffer[sVar4]);
        if ((int)uVar2 < 0) {
          return;
        }
        uVar3 = (ulong)uVar2;
        if (size_00 - 1 < uVar3) {
          return;
        }
        buffer_00 = buffer_00 + uVar3;
        size_00 = size_00 - uVar3;
        sVar4 = sVar4 + 1;
      } while (size != sVar4);
    }
  }
  return;
}

Assistant:

static void skipdata_opstr(char *opstr, const uint8_t *buffer, size_t size)
{
	char *p = opstr;
	int len;
	size_t i;
	size_t available = sizeof(((cs_insn*)NULL)->op_str);

	if (!size) {
		opstr[0] = '\0';
		return;
	}

	len = cs_snprintf(p, available, "0x%02x", buffer[0]);
	p+= len;
	available -= len;

	for(i = 1; i < size; i++) {
		len = cs_snprintf(p, available, ", 0x%02x", buffer[i]);
		if (len < 0) {
			break;
		}
		if ((size_t)len > available - 1) {
			break;
		}
		p+= len;
		available -= len;
	}
}